

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_nonce_gen
              (secp256k1_context *ctx,secp256k1_musig_secnonce *secnonce,
              secp256k1_musig_pubnonce *pubnonce,uchar *session_secrand32,uchar *seckey,
              secp256k1_pubkey *pubkey,uchar *msg32,secp256k1_musig_keyagg_cache *keyagg_cache,
              uchar *extra_input32)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  uchar *p;
  uint uVar9;
  undefined1 auVar10 [16];
  uint local_7c;
  secp256k1_pubkey *local_78;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  
  if (secnonce == (secp256k1_musig_secnonce *)0x0) {
    secp256k1_musig_nonce_gen_cold_2();
  }
  else {
    local_78 = pubkey;
    memset(secnonce,0,0x84);
    if (session_secrand32 == (uchar *)0x0) {
      secp256k1_musig_nonce_gen_cold_1();
      return 0;
    }
    auVar10[0] = -(session_secrand32[0x10] == '\0' && *session_secrand32 == '\0');
    auVar10[1] = -(session_secrand32[0x11] == '\0' && session_secrand32[1] == '\0');
    auVar10[2] = -(session_secrand32[0x12] == '\0' && session_secrand32[2] == '\0');
    auVar10[3] = -(session_secrand32[0x13] == '\0' && session_secrand32[3] == '\0');
    auVar10[4] = -(session_secrand32[0x14] == '\0' && session_secrand32[4] == '\0');
    auVar10[5] = -(session_secrand32[0x15] == '\0' && session_secrand32[5] == '\0');
    auVar10[6] = -(session_secrand32[0x16] == '\0' && session_secrand32[6] == '\0');
    auVar10[7] = -(session_secrand32[0x17] == '\0' && session_secrand32[7] == '\0');
    auVar10[8] = -(session_secrand32[0x18] == '\0' && session_secrand32[8] == '\0');
    auVar10[9] = -(session_secrand32[0x19] == '\0' && session_secrand32[9] == '\0');
    auVar10[10] = -(session_secrand32[0x1a] == '\0' && session_secrand32[10] == '\0');
    auVar10[0xb] = -(session_secrand32[0x1b] == '\0' && session_secrand32[0xb] == '\0');
    auVar10[0xc] = -(session_secrand32[0x1c] == '\0' && session_secrand32[0xc] == '\0');
    auVar10[0xd] = -(session_secrand32[0x1d] == '\0' && session_secrand32[0xd] == '\0');
    auVar10[0xe] = -(session_secrand32[0x1e] == '\0' && session_secrand32[0xe] == '\0');
    auVar10[0xf] = -(session_secrand32[0x1f] == '\0' && session_secrand32[0xf] == '\0');
    _zzq_args[0] = _zzq_args[0] & 0xffffffffffffff00;
    local_7c = (uint)((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar10[0xf] >> 7) << 0xf) != 0xffff);
    if (ctx->declassify != 0) {
      _zzq_args[0] = 0x4d430002;
      _zzq_args[1] = (unsigned_long)&local_7c;
      _zzq_args[2] = 4;
      _zzq_args[3] = 0;
      _zzq_args[4] = 0;
      _zzq_args[5] = 0;
      _zzq_result = 0;
    }
    if (local_7c != 0) {
      uVar7 = secp256k1_musig_nonce_gen_internal
                        (ctx,secnonce,pubnonce,session_secrand32,seckey,local_78,msg32,keyagg_cache,
                         extra_input32);
      cVar6 = (char)(uVar7 & local_7c) + -1;
      auVar10 = ZEXT216(CONCAT11(cVar6,cVar6));
      auVar10 = pshuflw(auVar10,auVar10,0);
      uVar9 = auVar10._0_4_;
      lVar8 = 0;
      do {
        puVar1 = (uint *)(session_secrand32 + lVar8);
        uVar3 = puVar1[1];
        uVar4 = puVar1[2];
        uVar5 = puVar1[3];
        puVar2 = (uint *)(session_secrand32 + lVar8);
        *puVar2 = *puVar1 & uVar9;
        puVar2[1] = uVar3 & uVar9;
        puVar2[2] = uVar4 & uVar9;
        puVar2[3] = uVar5 & uVar9;
        lVar8 = lVar8 + 0x10;
      } while (lVar8 != 0x20);
      return uVar7 & local_7c;
    }
    secp256k1_musig_secnonce_invalidate(ctx,secnonce,1);
  }
  return 0;
}

Assistant:

int secp256k1_musig_nonce_gen(const secp256k1_context* ctx, secp256k1_musig_secnonce *secnonce, secp256k1_musig_pubnonce *pubnonce, unsigned char *session_secrand32, const unsigned char *seckey, const secp256k1_pubkey *pubkey, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache, const unsigned char *extra_input32) {
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secnonce != NULL);
    memset(secnonce, 0, sizeof(*secnonce));
    ARG_CHECK(session_secrand32 != NULL);

    /* Check in constant time that the session_secrand32 is not 0 as a
     * defense-in-depth measure that may protect against a faulty RNG. */
    ret &= !secp256k1_is_zero_array(session_secrand32, 32);

    /* We can declassify because branching on ret is only relevant when this
     * function called with an invalid session_secrand32 argument */
    secp256k1_declassify(ctx, &ret, sizeof(ret));
    if (ret == 0) {
        secp256k1_musig_secnonce_invalidate(ctx, secnonce, 1);
        return 0;
    }

    ret &= secp256k1_musig_nonce_gen_internal(ctx, secnonce, pubnonce, session_secrand32, seckey, pubkey, msg32, keyagg_cache, extra_input32);

    /* Set the session_secrand32 buffer to zero to prevent the caller from using
     * nonce_gen multiple times with the same buffer. */
    secp256k1_memczero(session_secrand32, 32, ret);
    return ret;
}